

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool testing::internal::anon_unknown_37::IsGlobPattern(string *pattern)

{
  char *pcVar1;
  char cVar2;
  pointer pcVar3;
  char *pcVar4;
  size_type sVar5;
  long lVar6;
  char *pcVar7;
  char *pcVar8;
  
  pcVar3 = (pattern->_M_dataplus)._M_p;
  sVar5 = pattern->_M_string_length;
  pcVar1 = pcVar3 + sVar5;
  pcVar4 = pcVar3 + 1;
  for (lVar6 = (long)sVar5 >> 2; 0 < lVar6; lVar6 = lVar6 + -1) {
    if ((pcVar4[-1] == '*') || (pcVar4[-1] == '?')) {
      pcVar7 = pcVar4 + -1;
      goto LAB_00121784;
    }
    pcVar7 = pcVar4;
    if ((*pcVar4 == '*') || (*pcVar4 == '?')) goto LAB_00121784;
    if ((pcVar4[1] == '*') || (pcVar4[1] == '?')) {
      pcVar7 = pcVar4 + 1;
      goto LAB_00121784;
    }
    if ((pcVar4[2] == '*') || (pcVar4[2] == '?')) {
      pcVar7 = pcVar4 + 2;
      goto LAB_00121784;
    }
    pcVar4 = pcVar4 + 4;
    sVar5 = sVar5 - 4;
  }
  pcVar8 = pcVar4 + -1;
  if (sVar5 != 1) {
    if (sVar5 == 3) {
      cVar2 = *pcVar8;
      pcVar7 = pcVar8;
      if ((cVar2 == '*') || (pcVar8 = pcVar4, cVar2 == '?')) goto LAB_00121784;
    }
    else {
      pcVar7 = pcVar1;
      if (sVar5 != 2) goto LAB_00121784;
    }
    pcVar7 = pcVar8;
    if ((*pcVar8 == '*') || (*pcVar8 == '?')) goto LAB_00121784;
    pcVar8 = pcVar8 + 1;
  }
  pcVar7 = pcVar8;
  if ((*pcVar8 != '*') && (*pcVar8 != '?')) {
    pcVar7 = pcVar1;
  }
LAB_00121784:
  return pcVar7 != pcVar1;
}

Assistant:

bool IsGlobPattern(const std::string& pattern) {
  return std::any_of(pattern.begin(), pattern.end(),
                     [](const char c) { return c == '?' || c == '*'; });
}